

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O1

char * qulltoa2(char *p,qulonglong n,int base)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  char cVar3;
  ulong uVar4;
  char cVar5;
  bool bVar6;
  
  uVar4 = (ulong)base;
  do {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = n;
    cVar3 = SUB161(auVar2 % auVar1,0);
    cVar5 = cVar3 + '0';
    if (9 < SUB164(auVar2 % auVar1,0)) {
      cVar5 = cVar3 + 'W';
    }
    p[-1] = cVar5;
    p = p + -1;
    bVar6 = uVar4 <= n;
    n = n / uVar4;
  } while (bVar6);
  return p;
}

Assistant:

char *qulltoa2(char *p, qulonglong n, int base)
{
#if defined(QT_CHECK_RANGE)
    if (base < 2 || base > 36) {
        qWarning("QByteArray::setNum: Invalid base %d", base);
        base = 10;
    }
#endif
    qulltoString_helper(n, base, p);
    return p;
}